

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int FASTCOVER_checkParameters(ZDICT_cover_params_t parameters,size_t maxDictSize,uint f,uint accel)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((parameters.k != 0 && parameters.d != 0) &&
       (((parameters.d == 8 || (parameters.d == 6)) && (0xffffffe0 < f - 0x20)))) &&
      (((parameters.d <= parameters.k && (parameters.k <= maxDictSize)) &&
       (0.0 < parameters.splitPoint)))) && (parameters.splitPoint <= 1.0)) {
    uVar1 = (uint)(accel - 1 < 10);
  }
  return uVar1;
}

Assistant:

static int FASTCOVER_checkParameters(ZDICT_cover_params_t parameters,
                                     size_t maxDictSize, unsigned f,
                                     unsigned accel) {
  /* k, d, and f are required parameters */
  if (parameters.d == 0 || parameters.k == 0) {
    return 0;
  }
  /* d has to be 6 or 8 */
  if (parameters.d != 6 && parameters.d != 8) {
    return 0;
  }
  /* k <= maxDictSize */
  if (parameters.k > maxDictSize) {
    return 0;
  }
  /* d <= k */
  if (parameters.d > parameters.k) {
    return 0;
  }
  /* 0 < f <= FASTCOVER_MAX_F*/
  if (f > FASTCOVER_MAX_F || f == 0) {
    return 0;
  }
  /* 0 < splitPoint <= 1 */
  if (parameters.splitPoint <= 0 || parameters.splitPoint > 1) {
    return 0;
  }
  /* 0 < accel <= 10 */
  if (accel > 10 || accel == 0) {
    return 0;
  }
  return 1;
}